

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2f151d::NewExpr::printLeft(NewExpr *this,OutputStream *S)

{
  bool bVar1;
  StringView local_88;
  StringView local_78;
  StringView local_68;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  NewExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  if ((this->IsGlobal & 1U) != 0) {
    StringView::StringView(&local_28,"::operator ");
    OutputStream::operator+=(local_18,local_28);
  }
  StringView::StringView(&local_38,"new");
  OutputStream::operator+=(local_18,local_38);
  if ((this->IsArray & 1U) != 0) {
    StringView::StringView(&local_48,"[]");
    OutputStream::operator+=(local_18,local_48);
  }
  OutputStream::operator+=(local_18,' ');
  bVar1 = NodeArray::empty(&this->ExprList);
  if (!bVar1) {
    StringView::StringView(&local_58,"(");
    OutputStream::operator+=(local_18,local_58);
    NodeArray::printWithComma(&this->ExprList,local_18);
    StringView::StringView(&local_68,")");
    OutputStream::operator+=(local_18,local_68);
  }
  Node::print(this->Type,local_18);
  bVar1 = NodeArray::empty(&this->InitList);
  if (!bVar1) {
    StringView::StringView(&local_78,"(");
    OutputStream::operator+=(local_18,local_78);
    NodeArray::printWithComma(&this->InitList,local_18);
    StringView::StringView(&local_88,")");
    OutputStream::operator+=(local_18,local_88);
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsGlobal)
      S += "::operator ";
    S += "new";
    if (IsArray)
      S += "[]";
    S += ' ';
    if (!ExprList.empty()) {
      S += "(";
      ExprList.printWithComma(S);
      S += ")";
    }
    Type->print(S);
    if (!InitList.empty()) {
      S += "(";
      InitList.printWithComma(S);
      S += ")";
    }

  }